

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  cmCTestTestProperties *prop;
  bool bVar1;
  int n;
  Value *pVVar2;
  reference ppVar3;
  size_type sVar4;
  reference __lhs;
  StreamWriter *__p;
  pointer pSVar5;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> local_560;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> jout;
  string local_550;
  Value local_530;
  undefined1 local_508 [8];
  StreamWriterBuilder builder;
  Value local_4b0;
  undefined1 local_488 [8];
  Value testInfo;
  undefined1 local_458 [8];
  cmCTestRunTest testRun;
  cmWorkingDirectory workdir;
  cmCTestTestProperties *p;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *it;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  Value tests;
  BacktraceData backtraceGraph;
  Value local_60;
  undefined1 local_38 [8];
  Value result;
  cmCTestMultiProcessHandler *this_local;
  
  this_00 = this->TestHandler;
  result.limit_ = (ptrdiff_t)this;
  n = FindMaxIndex(this);
  cmCTestTestHandler::SetMaxIndex(this_00,n);
  Json::Value::Value((Value *)local_38,objectValue);
  Json::Value::Value(&local_60,"ctestInfo");
  pVVar2 = Json::Value::operator[]((Value *)local_38,"kind");
  Json::Value::operator=(pVVar2,&local_60);
  Json::Value::~Value(&local_60);
  DumpVersion((Value *)&backtraceGraph.Nodes.limit_,1,0);
  pVVar2 = Json::Value::operator[]((Value *)local_38,"version");
  Json::Value::operator=(pVVar2,(Value *)&backtraceGraph.Nodes.limit_);
  Json::Value::~Value((Value *)&backtraceGraph.Nodes.limit_);
  BacktraceData::BacktraceData((BacktraceData *)&tests.limit_);
  Json::Value::Value((Value *)&__range1,arrayValue);
  __end1 = std::
           map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ::begin(&(this->Properties).
                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  );
  it = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
       std::
       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ::end(&(this->Properties).
              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            );
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) {
      BacktraceData::Dump(&local_4b0,(BacktraceData *)&tests.limit_);
      pVVar2 = Json::Value::operator[]((Value *)local_38,"backtraceGraph");
      Json::Value::operator=(pVVar2,&local_4b0);
      Json::Value::~Value(&local_4b0);
      Json::Value::Value((Value *)&builder.settings_.limit_,(Value *)&__range1);
      pVVar2 = Json::Value::operator[]((Value *)local_38,"tests");
      Json::Value::operator=(pVVar2,(Value *)&builder.settings_.limit_);
      Json::Value::~Value((Value *)&builder.settings_.limit_);
      Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_508);
      Json::Value::Value(&local_530,"  ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_550,"indentation",
                 (allocator<char> *)
                 ((long)&jout._M_t.
                         super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
                         .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl + 7));
      pVVar2 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_508,&local_550);
      Json::Value::operator=(pVVar2,&local_530);
      std::__cxx11::string::~string((string *)&local_550);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&jout._M_t.
                         super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
                         .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl + 7));
      Json::Value::~Value(&local_530);
      __p = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_508);
      std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
      unique_ptr<std::default_delete<Json::StreamWriter>,void>
                ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)
                 &local_560,__p);
      pSVar5 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::
               operator->(&local_560);
      (*pSVar5->_vptr_StreamWriter[2])(pSVar5,local_38,&std::cout);
      std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
                (&local_560);
      Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_508);
      Json::Value::~Value((Value *)&__range1);
      BacktraceData::~BacktraceData((BacktraceData *)&tests.limit_);
      Json::Value::~Value((Value *)local_38);
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator*(&__end1);
    prop = ppVar3->second;
    cmWorkingDirectory::cmWorkingDirectory
              ((cmWorkingDirectory *)&testRun.TotalNumberOfTests,&prop->Directory);
    cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_458,this);
    cmCTestRunTest::SetIndex((cmCTestRunTest *)local_458,prop->Index);
    cmCTestRunTest::SetTestProperties((cmCTestRunTest *)local_458,prop);
    cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_458);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&prop->Args);
    if (sVar4 < 2) {
LAB_0023a406:
      DumpCTestInfo((Value *)local_488,(cmCTestRunTest *)local_458,prop,
                    (BacktraceData *)&tests.limit_);
      Json::Value::append((Value *)&__range1,(Value *)local_488);
      Json::Value::~Value((Value *)local_488);
      testInfo.limit_._4_4_ = 0;
    }
    else {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&prop->Args,1);
      bVar1 = std::operator==(__lhs,"NOT_AVAILABLE");
      if (!bVar1) goto LAB_0023a406;
      testInfo.limit_._4_4_ = 3;
    }
    cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_458);
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&testRun.TotalNumberOfTests);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}